

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O1

client * client_create(xcb_window_t window,xcb_rectangle_t rect,xcb_size_hints_t *hints)

{
  client *pcVar1;
  
  pcVar1 = (client *)malloc(0x20);
  if (pcVar1 == (client *)0x0) {
    pcVar1 = (client *)0x0;
  }
  else {
    pcVar1->window = window;
    pcVar1->rect = rect;
    pcVar1->size_hints = hints;
    if ((hints->flags & 0x20) == 0) {
      hints->max_width = 0xffff;
      hints->max_height = 0xffff;
    }
    if ((hints->flags & 0x10) == 0) {
      hints->min_width = 0;
      hints->min_height = 0;
    }
    pcVar1->is_focused = false;
    pcVar1->is_fullscreen = false;
    pcVar1->state = CLIENT_NORMAL|CLIENT_UNTHEMED;
  }
  return pcVar1;
}

Assistant:

struct client *client_create(xcb_window_t window, xcb_rectangle_t rect, xcb_size_hints_t *hints)
{
        struct client *client = malloc(sizeof(struct client));

        if (client == NULL) {
                return NULL;
        }

        client->window = window;
        client->rect = rect;
        client->size_hints = hints;

        // Initialize size_hints
        if (!(client->size_hints->flags & XCB_ICCCM_SIZE_HINT_P_MAX_SIZE)) {
                client->size_hints->max_width = UINT16_MAX;
                client->size_hints->max_height = UINT16_MAX;
        }

        if (!(client->size_hints->flags & XCB_ICCCM_SIZE_HINT_P_MIN_SIZE)) {
                client->size_hints->min_width = 0;
                client->size_hints->min_height = 0;
        }

        client->is_focused = false;
        client->is_fullscreen = false;
        client->state = CLIENT_NORMAL | CLIENT_UNTHEMED;

        return client;
}